

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

uint stb_hash_fast(void *p,int len)

{
  uint uVar1;
  uint val_1;
  uint val;
  uint hash;
  uchar *q;
  int len_local;
  void *p_local;
  
  if ((len < 1) || (p == (void *)0x0)) {
    p_local._4_4_ = 0;
  }
  else {
    val_1 = len;
    _val = (byte *)p;
    q._4_4_ = len;
    if (((ulong)p & 1) == 0) {
      for (; 3 < q._4_4_; q._4_4_ = q._4_4_ + -4) {
        uVar1 = (uint)*_val + (uint)_val[1] * 0x100 + val_1;
        uVar1 = uVar1 * 0x10000 ^ uVar1 ^ ((uint)_val[2] + (uint)_val[3] * 0x100) * 0x800;
        _val = _val + 4;
        val_1 = (uVar1 >> 0xb) + uVar1;
      }
    }
    else {
      for (; 3 < q._4_4_; q._4_4_ = q._4_4_ + -4) {
        uVar1 = (uint)*_val + (uint)_val[1] * 0x100 + val_1;
        uVar1 = uVar1 * 0x10000 ^ uVar1 ^ ((uint)_val[2] + (uint)_val[3] * 0x100) * 0x800;
        _val = _val + 4;
        val_1 = (uVar1 >> 0xb) + uVar1;
      }
    }
    switch(q._4_4_) {
    case 0:
      break;
    case 1:
      uVar1 = (*_val + val_1) * 0x400 ^ *_val + val_1;
      val_1 = (uVar1 >> 1) + uVar1;
      break;
    case 2:
      uVar1 = (uint)*_val + (uint)_val[1] * 0x100 + val_1;
      uVar1 = uVar1 * 0x800 ^ uVar1;
      val_1 = (uVar1 >> 0x11) + uVar1;
      break;
    case 3:
      uVar1 = (uint)*_val + (uint)_val[1] * 0x100 + val_1;
      uVar1 = (uint)_val[2] << 0x12 ^ uVar1 * 0x10000 ^ uVar1;
      val_1 = (uVar1 >> 0xb) + uVar1;
    }
    uVar1 = val_1 << 3 ^ val_1;
    uVar1 = (uVar1 >> 5) + uVar1;
    uVar1 = uVar1 * 0x10 ^ uVar1;
    uVar1 = (uVar1 >> 0x11) + uVar1;
    uVar1 = uVar1 * 0x2000000 ^ uVar1;
    p_local._4_4_ = (uVar1 >> 6) + uVar1;
  }
  return p_local._4_4_;
}

Assistant:

unsigned int stb_hash_fast(void *p, int len)
{
   unsigned char *q = (unsigned char *) p;
   unsigned int hash = len;

   if (len <= 0 || q == NULL) return 0;

   /* Main loop */
   if (((int) q & 1) == 0) {
      for (;len > 3; len -= 4) {
         unsigned int val;
         hash +=  stb__get16(q);
         val   = (stb__get16(q+2) << 11);
         hash  = (hash << 16) ^ hash ^ val;
         q    += 4;
         hash += hash >> 11;
      }
   } else {
      for (;len > 3; len -= 4) {
         unsigned int val;
         hash +=  stb__get16_slow(q);
         val   = (stb__get16_slow(q+2) << 11);
         hash  = (hash << 16) ^ hash ^ val;
         q    += 4;
         hash += hash >> 11;
      }
   }

   /* Handle end cases */
   switch (len) {
      case 3: hash += stb__get16_slow(q);
              hash ^= hash << 16;
              hash ^= q[2] << 18;
              hash += hash >> 11;
              break;
      case 2: hash += stb__get16_slow(q);
              hash ^= hash << 11;
              hash += hash >> 17;
              break;
      case 1: hash += q[0];
              hash ^= hash << 10;
              hash += hash >> 1;
              break;
      case 0: break;
   }

   /* Force "avalanching" of final 127 bits */
   hash ^= hash << 3;
   hash += hash >> 5;
   hash ^= hash << 4;
   hash += hash >> 17;
   hash ^= hash << 25;
   hash += hash >> 6;

   return hash;
}